

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeString::doReplace
          (UnicodeString *this,int32_t start,int32_t length,UnicodeString *src,int32_t srcStart,
          int32_t srcLength)

{
  UnicodeString *pUVar1;
  char16_t *srcChars;
  int32_t local_28;
  int32_t local_24;
  
  local_28 = srcLength;
  local_24 = srcStart;
  pinIndices(src,&local_24,&local_28);
  if (((src->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
    srcChars = (src->fUnion).fFields.fArray;
  }
  else {
    srcChars = (src->fUnion).fStackFields.fBuffer;
  }
  pUVar1 = doReplace(this,start,length,srcChars,local_24,local_28);
  return pUVar1;
}

Assistant:

UnicodeString&
UnicodeString::doReplace( int32_t start,
              int32_t length,
              const UnicodeString& src,
              int32_t srcStart,
              int32_t srcLength)
{
  // pin the indices to legal values
  src.pinIndices(srcStart, srcLength);

  // get the characters from src
  // and replace the range in ourselves with them
  return doReplace(start, length, src.getArrayStart(), srcStart, srcLength);
}